

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Result * __thiscall
testing::internal::
FunctionMocker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
::Invoke(Result *__return_storage_ptr__,
        FunctionMocker<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
        *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *args)

{
  UntypedActionResultHolderBase *pUVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  UntypedActionResultHolderBase *pUVar5;
  long lVar6;
  bool bVar7;
  ArgumentTuple tuple;
  GTestLog local_1c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_18;
  
  local_18 = args;
  pUVar5 = UntypedFunctionMockerBase::UntypedInvokeWith
                     (&this->super_UntypedFunctionMockerBase,&local_18);
  if (pUVar5 == (UntypedActionResultHolderBase *)0x0) {
    bVar7 = true;
  }
  else {
    lVar6 = __dynamic_cast(pUVar5,&UntypedActionResultHolderBase::typeinfo,
                           &ActionResultHolder<std::__cxx11::string>::typeinfo,0);
    bVar7 = lVar6 != 0;
  }
  bVar7 = IsTrue(bVar7);
  if (!bVar7) {
    GTestLog::GTestLog(&local_1c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/googletest/repo/googletest/include/gtest/internal/gtest-port.h"
                       ,0x44d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Condition f == nullptr || dynamic_cast<To>(f) != nullptr failed. ",0x41);
    GTestLog::~GTestLog(&local_1c);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pUVar1 = pUVar5 + 3;
  if ((UntypedActionResultHolderBase *)pUVar5[1]._vptr_UntypedActionResultHolderBase == pUVar1) {
    uVar2 = *(undefined4 *)((long)&pUVar5[3]._vptr_UntypedActionResultHolderBase + 4);
    uVar3 = *(undefined4 *)&pUVar5[4]._vptr_UntypedActionResultHolderBase;
    uVar4 = *(undefined4 *)((long)&pUVar5[4]._vptr_UntypedActionResultHolderBase + 4);
    *(undefined4 *)&__return_storage_ptr__->field_2 =
         *(undefined4 *)&pUVar1->_vptr_UntypedActionResultHolderBase;
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 4) = uVar2;
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 0xc) = uVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p =
         (pointer)pUVar5[1]._vptr_UntypedActionResultHolderBase;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         (size_type)pUVar1->_vptr_UntypedActionResultHolderBase;
  }
  __return_storage_ptr__->_M_string_length =
       (size_type)pUVar5[2]._vptr_UntypedActionResultHolderBase;
  pUVar5[1]._vptr_UntypedActionResultHolderBase = (_func_int **)pUVar1;
  pUVar5[2]._vptr_UntypedActionResultHolderBase = (_func_int **)0x0;
  *(undefined1 *)&pUVar5[3]._vptr_UntypedActionResultHolderBase = 0;
  if (pUVar5 != (UntypedActionResultHolderBase *)0x0) {
    (*pUVar5->_vptr_UntypedActionResultHolderBase[1])(pUVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }